

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swab.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_dd8::ByteSwapWrapper::ByteSwapWrapper
          (ByteSwapWrapper *this,string *data_type,int start_address,int start_offset,
          int end_address,int end_offset)

{
  bool bVar1;
  ByteSwap<float> *this_00;
  void *pvVar2;
  undefined8 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  ByteSwap<long_double> *in_stack_ffffffffffffff80;
  
  *in_RDI = 0;
  bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (bVar1) {
    pvVar2 = operator_new(0x18);
    ByteSwap<short>::ByteSwap
              ((ByteSwap<short> *)in_stack_ffffffffffffff80,
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70);
    *in_RDI = pvVar2;
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (bVar1) {
      pvVar2 = operator_new(0x18);
      ByteSwap<sptk::int24_t>::ByteSwap
                ((ByteSwap<sptk::int24_t> *)in_stack_ffffffffffffff80,
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
                 (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70);
      *in_RDI = pvVar2;
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (bVar1) {
        pvVar2 = operator_new(0x18);
        ByteSwap<int>::ByteSwap
                  ((ByteSwap<int> *)in_stack_ffffffffffffff80,
                   (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
                   (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70);
        *in_RDI = pvVar2;
      }
      else {
        bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        if (bVar1) {
          pvVar2 = operator_new(0x18);
          ByteSwap<long>::ByteSwap
                    ((ByteSwap<long> *)in_stack_ffffffffffffff80,
                     (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
                     (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70)
          ;
          *in_RDI = pvVar2;
        }
        else {
          bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          if (bVar1) {
            pvVar2 = operator_new(0x18);
            ByteSwap<unsigned_short>::ByteSwap
                      ((ByteSwap<unsigned_short> *)in_stack_ffffffffffffff80,
                       (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                       (int)in_stack_ffffffffffffff78,
                       (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                       (int)in_stack_ffffffffffffff70);
            *in_RDI = pvVar2;
          }
          else {
            bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
            if (bVar1) {
              pvVar2 = operator_new(0x18);
              ByteSwap<sptk::uint24_t>::ByteSwap
                        ((ByteSwap<sptk::uint24_t> *)in_stack_ffffffffffffff80,
                         (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                         (int)in_stack_ffffffffffffff78,
                         (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                         (int)in_stack_ffffffffffffff70);
              *in_RDI = pvVar2;
            }
            else {
              bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
              if (bVar1) {
                pvVar2 = operator_new(0x18);
                ByteSwap<unsigned_int>::ByteSwap
                          ((ByteSwap<unsigned_int> *)in_stack_ffffffffffffff80,
                           (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                           (int)in_stack_ffffffffffffff78,
                           (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           (int)in_stack_ffffffffffffff70);
                *in_RDI = pvVar2;
              }
              else {
                bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
                if (bVar1) {
                  pvVar2 = operator_new(0x18);
                  ByteSwap<unsigned_long>::ByteSwap
                            ((ByteSwap<unsigned_long> *)in_stack_ffffffffffffff80,
                             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                             (int)in_stack_ffffffffffffff78,
                             (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                             (int)in_stack_ffffffffffffff70);
                  *in_RDI = pvVar2;
                }
                else {
                  bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
                  if (bVar1) {
                    this_00 = (ByteSwap<float> *)operator_new(0x18);
                    ByteSwap<float>::ByteSwap
                              (this_00,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                               (int)in_stack_ffffffffffffff78,
                               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                               (int)in_stack_ffffffffffffff70);
                    *in_RDI = this_00;
                  }
                  else {
                    bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
                    if (bVar1) {
                      pvVar2 = operator_new(0x18);
                      ByteSwap<double>::ByteSwap
                                ((ByteSwap<double> *)in_stack_ffffffffffffff80,
                                 (int)((ulong)pvVar2 >> 0x20),(int)pvVar2,
                                 (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                                 (int)in_stack_ffffffffffffff70);
                      *in_RDI = pvVar2;
                    }
                    else {
                      bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
                      if (bVar1) {
                        pvVar2 = operator_new(0x18);
                        ByteSwap<long_double>::ByteSwap
                                  (in_stack_ffffffffffffff80,
                                   (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                                   (int)in_stack_ffffffffffffff78,(int)((ulong)pvVar2 >> 0x20),
                                   (int)pvVar2);
                        *in_RDI = pvVar2;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

ByteSwapWrapper(const std::string& data_type, int start_address,
                  int start_offset, int end_address, int end_offset)
      : byte_swap_(NULL) {
    if ("s" == data_type) {
      byte_swap_ = new ByteSwap<std::int16_t>(start_address, start_offset,
                                              end_address, end_offset);
    } else if ("h" == data_type) {
      byte_swap_ = new ByteSwap<sptk::int24_t>(start_address, start_offset,
                                               end_address, end_offset);
    } else if ("i" == data_type) {
      byte_swap_ = new ByteSwap<std::int32_t>(start_address, start_offset,
                                              end_address, end_offset);
    } else if ("l" == data_type) {
      byte_swap_ = new ByteSwap<std::int64_t>(start_address, start_offset,
                                              end_address, end_offset);
    } else if ("S" == data_type) {
      byte_swap_ = new ByteSwap<std::uint16_t>(start_address, start_offset,
                                               end_address, end_offset);
    } else if ("H" == data_type) {
      byte_swap_ = new ByteSwap<sptk::uint24_t>(start_address, start_offset,
                                                end_address, end_offset);
    } else if ("I" == data_type) {
      byte_swap_ = new ByteSwap<std::uint32_t>(start_address, start_offset,
                                               end_address, end_offset);
    } else if ("L" == data_type) {
      byte_swap_ = new ByteSwap<std::uint64_t>(start_address, start_offset,
                                               end_address, end_offset);
    } else if ("f" == data_type) {
      byte_swap_ = new ByteSwap<float>(start_address, start_offset, end_address,
                                       end_offset);
    } else if ("d" == data_type) {
      byte_swap_ = new ByteSwap<double>(start_address, start_offset,
                                        end_address, end_offset);
    } else if ("e" == data_type) {
      byte_swap_ = new ByteSwap<long double>(start_address, start_offset,
                                             end_address, end_offset);
    }
  }